

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDCpp14.h
# Opt level: O0

_Unknown_bound __thiscall mmd::make_unique<pmx::PmxJoint[]>(mmd *this,size_t n)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  size_t *psVar3;
  PmxJoint *__p;
  ulong uVar4;
  PmxJoint *local_58;
  size_t n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = n;
  uVar2 = SUB168(auVar1 * ZEXT816(0xb0),0);
  uVar4 = uVar2 + 8;
  if (SUB168(auVar1 * ZEXT816(0xb0),8) != 0 || 0xfffffffffffffff7 < uVar2) {
    uVar4 = 0xffffffffffffffff;
  }
  psVar3 = (size_t *)operator_new__(uVar4);
  *psVar3 = n;
  __p = (PmxJoint *)(psVar3 + 1);
  if (n != 0) {
    local_58 = __p;
    do {
      (local_58->param).spring_rotation_coefficient[0] = 0.0;
      (local_58->param).spring_rotation_coefficient[1] = 0.0;
      *(undefined8 *)((local_58->param).spring_rotation_coefficient + 2) = 0;
      *(undefined8 *)((local_58->param).rotation_limitation_max + 2) = 0;
      (local_58->param).spring_move_coefficient[1] = 0.0;
      (local_58->param).spring_move_coefficient[2] = 0.0;
      (local_58->param).rotation_limitation_min[1] = 0.0;
      (local_58->param).rotation_limitation_min[2] = 0.0;
      (local_58->param).rotation_limitation_max[0] = 0.0;
      (local_58->param).rotation_limitation_max[1] = 0.0;
      (local_58->param).move_limitation_max[0] = 0.0;
      (local_58->param).move_limitation_max[1] = 0.0;
      *(undefined8 *)((local_58->param).move_limitation_max + 2) = 0;
      *(undefined8 *)((local_58->param).orientaiton + 2) = 0;
      (local_58->param).move_limitation_min[1] = 0.0;
      (local_58->param).move_limitation_min[2] = 0.0;
      (local_58->param).position[1] = 0.0;
      (local_58->param).position[2] = 0.0;
      (local_58->param).orientaiton[0] = 0.0;
      (local_58->param).orientaiton[1] = 0.0;
      local_58->joint_type = Generic6DofSpring;
      *(undefined3 *)&local_58->field_0x41 = 0;
      (local_58->param).rigid_body1 = 0;
      (local_58->param).rigid_body2 = 0;
      (local_58->param).position[0] = 0.0;
      (local_58->joint_english_name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(local_58->joint_english_name).field_2 + 8) = 0;
      *(undefined8 *)&local_58->joint_english_name = 0;
      (local_58->joint_english_name)._M_string_length = 0;
      (local_58->joint_name).field_2._M_allocated_capacity = 0;
      *(undefined8 *)((long)&(local_58->joint_name).field_2 + 8) = 0;
      *(undefined8 *)&local_58->joint_name = 0;
      (local_58->joint_name)._M_string_length = 0;
      pmx::PmxJoint::PmxJoint(local_58);
      local_58 = local_58 + 1;
    } while (local_58 != __p + n);
  }
  std::unique_ptr<pmx::PmxJoint[],std::default_delete<pmx::PmxJoint[]>>::
  unique_ptr<pmx::PmxJoint*,std::default_delete<pmx::PmxJoint[]>,void,bool>
            ((unique_ptr<pmx::PmxJoint[],std::default_delete<pmx::PmxJoint[]>> *)this,__p);
  return (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)
         (__uniq_ptr_data<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>,_true,_true>)this;
}

Assistant:

typename _Unique_if<T>::_Unknown_bound
        make_unique(size_t n) {
            typedef typename std::remove_extent<T>::type U;
            return std::unique_ptr<T>(new U[n]());
        }